

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcZShapeProfileDef::IfcZShapeProfileDef(IfcZShapeProfileDef *this)

{
  IfcZShapeProfileDef *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xc0,"IfcZShapeProfileDef");
  IfcParameterizedProfileDef::IfcParameterizedProfileDef
            (&this->super_IfcParameterizedProfileDef,&PTR_construction_vtable_24__010d8350);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcZShapeProfileDef,_6UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcZShapeProfileDef,_6UL> *)
             &(this->super_IfcParameterizedProfileDef).field_0x70,
             &PTR_construction_vtable_24__010d8398);
  (this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x10d82c0;
  *(undefined8 *)&this->field_0xc0 = 0x10d8338;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.field_0x58 =
       0x10d82e8;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x70 = 0x10d8310;
  STEP::Maybe<double>::Maybe(&this->FilletRadius);
  STEP::Maybe<double>::Maybe(&this->EdgeRadius);
  return;
}

Assistant:

IfcZShapeProfileDef() : Object("IfcZShapeProfileDef") {}